

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

float_t __thiscall djb::tab_r::ndf_std_radial(tab_r *this,float_t zm)

{
  pointer pfVar1;
  float fVar2;
  float_t u;
  float_t w;
  int i2;
  int i1;
  float local_2c;
  int local_28;
  int local_24;
  
  if (zm < 0.0) {
    return 0.0;
  }
  fVar2 = acosf(zm);
  fVar2 = fVar2 * 0.63661975;
  if (fVar2 < 0.0) {
    u = sqrtf(fVar2);
  }
  else {
    u = SQRT(fVar2);
  }
  pfVar1 = (this->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  spline::uwrap_edge(u,(int)((ulong)((long)(this->m_ndf).
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_finish - (long)pfVar1) >> 2),
                     &local_24,&local_28,&local_2c);
  return (pfVar1[local_28] - pfVar1[local_24]) * local_2c + pfVar1[local_24];
}

Assistant:

float_t tab_r::ndf_std_radial(float_t zm) const
{
	if (zm >= 0) {
		float_t u = sqrt(acos(zm) * (2 / m_pi()));
		return spline::eval(m_ndf, (int)m_ndf.size(), spline::uwrap_edge, u);
	}

	return 0;
}